

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.h
# Opt level: O0

void __thiscall
slang::ast::ConditionalExpression::visitExprs<LookupLhsIdentifier&>
          (ConditionalExpression *this,LookupLhsIdentifier *visitor)

{
  bool bVar1;
  iterator this_00;
  iterator visitor_00;
  ConditionalExpression *in_RDI;
  Condition *cond;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> *__range3;
  Expression *in_stack_ffffffffffffffd0;
  span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>
  *in_stack_ffffffffffffffd8;
  
  this_00 = std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>::
            begin((span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>
                   *)in_RDI);
  visitor_00 = std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>
               ::end(in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::ConditionalExpression::Condition_*,_std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::ConditionalExpression::Condition_*,_std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_slang::ast::ConditionalExpression::Condition_*,_std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffd0 =
         (Expression *)
         __gnu_cxx::
         __normal_iterator<const_slang::ast::ConditionalExpression::Condition_*,_std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>_>
         ::operator*((__normal_iterator<const_slang::ast::ConditionalExpression::Condition_*,_std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>_>
                      *)&stack0xffffffffffffffe0);
    not_null<const_slang::ast::Expression_*>::operator->
              ((not_null<const_slang::ast::Expression_*> *)0x22cc6e);
    Expression::visit<LookupLhsIdentifier&>(in_stack_ffffffffffffffd0,(LookupLhsIdentifier *)in_RDI)
    ;
    if ((in_stack_ffffffffffffffd0->type).ptr != (Type *)0x0) {
      Pattern::visit<LookupLhsIdentifier>
                ((Pattern *)this_00._M_current,(LookupLhsIdentifier *)visitor_00._M_current);
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::ConditionalExpression::Condition_*,_std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<const_slang::ast::ConditionalExpression::Condition_*,_std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffffe0);
  }
  left(in_RDI);
  Expression::visit<LookupLhsIdentifier&>(in_stack_ffffffffffffffd0,(LookupLhsIdentifier *)in_RDI);
  right(in_RDI);
  Expression::visit<LookupLhsIdentifier&>(in_stack_ffffffffffffffd0,(LookupLhsIdentifier *)in_RDI);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& cond : conditions) {
            cond.expr->visit(visitor);
            if (cond.pattern)
                cond.pattern->visit(visitor);
        }

        left().visit(visitor);
        right().visit(visitor);
    }